

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::NullaryScatter<long,duckdb::CountStarFunction>
               (Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_68;
  
  if (states->vector_type != FLAT_VECTOR) {
    if (states->vector_type == CONSTANT_VECTOR) {
      **(long **)states->data = **(long **)states->data + count;
    }
    else {
      UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
      Vector::ToUnifiedFormat(states,count,&local_68);
      NullaryScatterLoop<long,duckdb::CountStarFunction>
                ((long **)local_68.data,aggr_input_data,local_68.sel,count);
      UnifiedVectorFormat::~UnifiedVectorFormat(&local_68);
    }
    return;
  }
  NullaryFlatLoop<long,duckdb::CountStarFunction>((long **)states->data,aggr_input_data,count);
  return;
}

Assistant:

static void NullaryScatter(Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			OP::template ConstantOperation<STATE_TYPE, OP>(**sdata, aggr_input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			NullaryFlatLoop<STATE_TYPE, OP>(sdata, aggr_input_data, count);
#endif
		} else {
			UnifiedVectorFormat sdata;
			states.ToUnifiedFormat(count, sdata);
			NullaryScatterLoop<STATE_TYPE, OP>((STATE_TYPE **)sdata.data, aggr_input_data, *sdata.sel, count);
		}
	}